

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O0

Byte * __thiscall
CharStringType2Interpreter::InterpretNumber
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  int iVar1;
  double dVar2;
  CharStringType2Interpreter *pCStack_40;
  EStatusCode status;
  Byte *newPosition;
  CharStringOperand operand;
  LongFilePositionType inReadLimit_local;
  Byte *inProgramCounter_local;
  CharStringType2Interpreter *this_local;
  
  if (inReadLimit < 1) {
    this_local = (CharStringType2Interpreter *)0x0;
  }
  else {
    if ((*inProgramCounter == '\x1c') && (2 < inReadLimit)) {
      newPosition._0_1_ = 1;
      operand._0_8_ =
           SEXT28((short)((ushort)inProgramCounter[1] * 0x100 + (ushort)inProgramCounter[2]));
      pCStack_40 = (CharStringType2Interpreter *)(inProgramCounter + 3);
    }
    else if ((*inProgramCounter < 0x20) || (0xf6 < *inProgramCounter)) {
      if (((*inProgramCounter < 0xf7) || (0xfa < *inProgramCounter)) || (inReadLimit < 2)) {
        if (((*inProgramCounter < 0xfb) || (0xfe < *inProgramCounter)) || (inReadLimit < 2)) {
          if ((*inProgramCounter == 0xff) && (4 < inReadLimit)) {
            newPosition._0_1_ = 0;
            dVar2 = (double)(int)CONCAT11(inProgramCounter[1],inProgramCounter[2]);
            if (dVar2 <= 0.0) {
              operand._0_8_ =
                   dVar2 - (double)((uint)inProgramCounter[3] * 0x100 + (uint)inProgramCounter[4]) /
                           65536.0;
            }
            else {
              operand._0_8_ =
                   (double)((uint)inProgramCounter[3] * 0x100 + (uint)inProgramCounter[4]) / 65536.0
                   + dVar2;
            }
            pCStack_40 = (CharStringType2Interpreter *)(inProgramCounter + 5);
          }
          else {
            pCStack_40 = (CharStringType2Interpreter *)0x0;
          }
        }
        else {
          newPosition._0_1_ = 1;
          operand._0_8_ =
               SEXT48((int)(((short)(*inProgramCounter - 0xfb) * -0x100 - (uint)inProgramCounter[1])
                           + -0x6c));
          pCStack_40 = (CharStringType2Interpreter *)(inProgramCounter + 2);
        }
      }
      else {
        newPosition._0_1_ = 1;
        operand._0_8_ =
             SEXT48((int)((*inProgramCounter - 0xf7) * 0x100 + (uint)inProgramCounter[1] + 0x6c));
        pCStack_40 = (CharStringType2Interpreter *)(inProgramCounter + 2);
      }
    }
    else {
      newPosition._0_1_ = 1;
      operand._0_8_ = SEXT48((short)(ushort)*inProgramCounter + -0x8b);
      pCStack_40 = (CharStringType2Interpreter *)(inProgramCounter + 1);
    }
    if (pCStack_40 != (CharStringType2Interpreter *)0x0) {
      operand.field_1 = (anon_union_8_2_3d487603_for_CharStringOperand_1)inReadLimit;
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::push_back
                (&this->mOperandStack,(value_type *)&newPosition);
      iVar1 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[1])
                        (this->mImplementationHelper,&newPosition);
      if (iVar1 != 0) {
        return (Byte *)0x0;
      }
    }
    this_local = pCStack_40;
  }
  return (Byte *)this_local;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretNumber(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	CharStringOperand operand;
	Byte* newPosition = inProgramCounter;

	if(inReadLimit < 1)
		return NULL; // error, cant read a single byte

	if(28 == *newPosition && inReadLimit >= 3)
	{
		operand.IsInteger = true;
		operand.IntegerValue = (short)(
									((unsigned short)(*(newPosition+1)) << 8) + (*(newPosition+2)));
		newPosition += 3;
	} 
	else if(32 <= *newPosition && *newPosition <= 246)
	{
		operand.IsInteger = true;
		operand.IntegerValue = (short)*newPosition - 139;
		++newPosition;
	}
	else if(247 <= *newPosition && *newPosition <= 250  && inReadLimit >= 2)
	{
		operand.IsInteger = true;
		operand.IntegerValue = (*newPosition - 247) * 256 + *(newPosition + 1) + 108;
		newPosition += 2;
	}
	else if(251 <= *newPosition && *newPosition <= 254  && inReadLimit >= 2)
	{
		operand.IsInteger = true;
		operand.IntegerValue = -(short)(*newPosition - 251) * 256 - *(newPosition + 1) - 108;
		newPosition += 2;
	}
	else if(255 == *newPosition  && inReadLimit >= 5)
	{
		operand.IsInteger = false;
		operand.RealValue = (short)(((unsigned short)(*(newPosition+1)) << 8) + (*(newPosition+2)));
			if(operand.RealValue > 0)
				operand.RealValue+=
					(double)(((unsigned short)(*(newPosition+3)) << 8) + (*(newPosition+4))) /
								(1 << 16);
			else
				operand.RealValue-=
					(double)(((unsigned short)(*(newPosition+3)) << 8) + (*(newPosition+4))) /
								(1 << 16);
		newPosition += 5;
	}
	else
		newPosition = NULL; // error

	if(newPosition)
	{
		mOperandStack.push_back(operand);
		EStatusCode status = mImplementationHelper->Type2InterpretNumber(operand);
		if(status != eSuccess)
			return NULL;

	}

	return newPosition;
}